

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::HeapType> * __thiscall
wasm::WATParser::ParseDefsCtx::getBlockTypeFromTypeUse
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,HeapType type
          )

{
  bool bVar1;
  HeapType local_18;
  HeapType type_local;
  
  local_18.id = type.id;
  bVar1 = HeapType::isSignature(&local_18);
  if (bVar1) {
    *(uintptr_t *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err> = local_18.id;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::Err> + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  __assert_fail("type.isSignature()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/contexts.h"
                ,0x5ee,
                "Result<HeapType> wasm::WATParser::ParseDefsCtx::getBlockTypeFromTypeUse(Index, HeapType)"
               );
}

Assistant:

Result<HeapType> getBlockTypeFromTypeUse(Index pos, HeapType type) {
    assert(type.isSignature());
    // TODO: Error if block parameters are named
    return type;
  }